

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int get_signed_attribute(stack_st_X509_ATTRIBUTE *attribs,int nid,int type,char **buffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  void *__src;
  char *pcVar5;
  FILE *pFVar6;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar7;
  FILE *pFVar8;
  FILE *pFVar9;
  X509_NAME *pXVar10;
  char *pcVar11;
  X509_NAME *b;
  X509 *pXVar12;
  BIO *bp;
  PKCS7 *pPVar13;
  X509_EXTENSION *pXVar14;
  ulong uVar15;
  ulong uVar16;
  FILE *extraout_RDX;
  undefined8 uVar17;
  X509 *pXVar18;
  long lVar19;
  X509 *unaff_R12;
  int *piVar20;
  X509 *unaff_R13;
  char **buf;
  ulong uVar21;
  char **unaff_R15;
  char **ppcVar22;
  ASN1_TYPE *asn1_type;
  uint uStack_1d8c;
  PKCS7 *pPStack_1d88;
  BIO *pBStack_1d80;
  long lStack_1d78;
  byte abStack_1d70 [64];
  char acStack_1d30 [1024];
  char acStack_1930 [1032];
  X509 *pXStack_1528;
  int *piStack_1520;
  X509 *pXStack_1518;
  FILE *pFStack_1510;
  FILE *pFStack_1508;
  X509 *pXStack_1500;
  FILE *pFStack_14f0;
  FILE aFStack_14e8 [4];
  FILE *pFStack_10e0;
  int *piStack_10d8;
  X509 *pXStack_10d0;
  FILE *pFStack_10c8;
  FILE *pFStack_10c0;
  X509 *pXStack_10b8;
  X509 aXStack_10b0 [5];
  X509 aXStack_cb0 [5];
  char acStack_8b0 [2056];
  FILE *pFStack_a8;
  X509 *pXStack_a0;
  FILE *local_30;
  
  pcVar11 = (char *)(ulong)(uint)nid;
  iVar2 = get_attribute(attribs,nid,(ASN1_TYPE **)&local_30);
  if (iVar2 != 0) {
    if (v_flag == 0) {
      return 1;
    }
    get_signed_attribute_cold_1();
    return 1;
  }
  buf = (char **)local_30;
  iVar2 = ASN1_TYPE_get((ASN1_TYPE *)local_30);
  if (iVar2 == type) {
    uVar3 = ASN1_STRING_length((ASN1_STRING *)local_30->_IO_read_ptr);
    if ((int)uVar3 < 1) {
      return 1;
    }
    unaff_R15 = (char **)(ulong)uVar3;
    if (d_flag != 0) {
      pcVar11 = pname;
      printf("%s: allocating %d bytes for attribute\n",pname,unaff_R15);
    }
    buf = (char **)(ulong)((type == 0x13) + uVar3);
    pcVar4 = (char *)malloc((size_t)buf);
    *buffer = pcVar4;
    if (pcVar4 != (char *)0x0) {
      __src = (void *)ASN1_STRING_get0_data((X509_ALGOR *)local_30->_IO_read_ptr);
      memcpy(pcVar4,__src,(size_t)unaff_R15);
      if (type != 0x13) {
        return 0;
      }
      (*buffer)[(long)unaff_R15] = '\0';
      return 0;
    }
  }
  else {
    get_signed_attribute_cold_2();
  }
  get_signed_attribute_cold_3();
  pcVar4 = pname;
  pXVar12 = (X509 *)((ulong)pcVar11 & 0xffffffff);
  if (d_flag != 0) {
    pcVar5 = OBJ_nid2sn((int)pcVar11);
    printf("%s: finding attribute %s\n",pcVar4,pcVar5);
    unaff_R15 = (char **)pcVar4;
  }
  *(long *)extraout_RDX = 0;
  pXVar18 = pXVar12;
  pFVar6 = (FILE *)OBJ_nid2obj((int)pcVar11);
  if (pFVar6 != (FILE *)0x0) {
    iVar2 = OPENSSL_sk_num(buf);
    if (0 < iVar2) {
      pXVar12 = (X509 *)0x0;
      do {
        unaff_R12 = (X509 *)OPENSSL_sk_value(buf,pXVar12);
        a = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)unaff_R12);
        iVar2 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar6);
        if ((iVar2 == 0) &&
           (pXVar18 = unaff_R12, iVar2 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)unaff_R12),
           iVar2 != 0)) {
          if (*(long *)extraout_RDX != 0) {
            get_attribute_cold_1();
            unaff_R15 = (char **)pFVar6;
            goto LAB_0010d99b;
          }
          pAVar7 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)unaff_R12,0);
          *(ASN1_TYPE **)extraout_RDX = pAVar7;
        }
        uVar3 = (int)pXVar12 + 1;
        pXVar12 = (X509 *)(ulong)uVar3;
        iVar2 = OPENSSL_sk_num(buf);
      } while ((int)uVar3 < iVar2);
    }
    return (int)(*(long *)extraout_RDX == 0);
  }
LAB_0010d99b:
  get_attribute_cold_2();
  pFVar6 = *(FILE **)(*(long *)(*(long *)(pXVar18->sha1_hash + 0x10) + 0x20) + 0x18);
  pFVar8 = (FILE *)OPENSSL_sk_value(pFVar6,0);
  if (pFVar8 == (FILE *)0x0) {
    write_crl_cold_3();
LAB_0010da68:
    write_crl_cold_2();
    pFVar9 = extraout_RDX;
  }
  else {
    unaff_R15 = &w_char;
    pFVar6 = (FILE *)w_char;
    pFVar9 = fopen(w_char,"w");
    buf = (char **)pFVar8;
    if (pFVar9 == (FILE *)0x0) goto LAB_0010da68;
    if (v_flag != 0) {
      printf("%s: writing CRL\n",pname);
    }
    if (d_flag != 0) {
      PEM_write_X509_CRL(_stdout,(X509_CRL *)pFVar8);
    }
    pFVar6 = pFVar9;
    iVar2 = PEM_write_X509_CRL(pFVar9,(X509_CRL *)pFVar8);
    if (iVar2 == 1) {
      printf("%s: CRL written as %s\n",pname,w_char);
      iVar2 = fclose(pFVar9);
      return iVar2;
    }
  }
  write_crl_cold_1();
  localcert = (X509 *)0x0;
  pFVar6 = *(FILE **)(*(long *)(pFVar6->__pad5 + 0x20) + 0x10);
  piVar20 = &v_flag;
  pFStack_a8 = pFVar9;
  pXStack_a0 = unaff_R12;
  if (v_flag != 0) {
    pXStack_10b8 = (X509 *)0x10dab3;
    uVar3 = OPENSSL_sk_num(pFVar6);
    pXStack_10b8 = (X509 *)0x10dac3;
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
  }
  pXStack_10b8 = (X509 *)0x10dacb;
  pFVar8 = pFVar6;
  iVar2 = OPENSSL_sk_num();
  pXVar18 = (X509 *)localcert;
  if (0 < iVar2) {
    buf = (char **)0x0;
    do {
      pXStack_10b8 = (X509 *)0x10dae1;
      unaff_R13 = (X509 *)OPENSSL_sk_value(pFVar6,buf);
      pcVar11 = pname;
      if (v_flag != 0) {
        pXStack_10b8 = (X509 *)0x10db01;
        pXVar10 = X509_get_subject_name(unaff_R13);
        pXStack_10b8 = (X509 *)0x10db14;
        pcVar4 = X509_NAME_oneline(pXVar10,(char *)aXStack_10b0,0x400);
        pXStack_10b8 = (X509 *)0x10db28;
        printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar11,pcVar4);
        pXStack_10b8 = (X509 *)0x10db30;
        pXVar10 = X509_get_issuer_name(unaff_R13);
        pXStack_10b8 = (X509 *)0x10db40;
        pcVar11 = X509_NAME_oneline(pXVar10,(char *)aXStack_10b0,0x400);
        pXStack_10b8 = (X509 *)0x10db51;
        printf("  issuer: %s\n",pcVar11);
        pXStack_10b8 = (X509 *)0x10db5d;
        pXVar10 = (X509_NAME *)X509_REQ_get_subject_name(request);
        pXStack_10b8 = (X509 *)0x10db6d;
        pcVar11 = X509_NAME_oneline(pXVar10,(char *)aXStack_10b0,0x400);
        pXStack_10b8 = (X509 *)0x10db7e;
        printf("  request_subject: \'%s\'\n",pcVar11);
        pXVar12 = aXStack_10b0;
      }
      pXStack_10b8 = (X509 *)0x10db86;
      pXVar10 = X509_get_subject_name(unaff_R13);
      pXStack_10b8 = (X509 *)0x10db95;
      b = (X509_NAME *)X509_REQ_get_subject_name(request);
      pXStack_10b8 = (X509 *)0x10dba0;
      iVar2 = X509_NAME_cmp(pXVar10,b);
      if (d_flag != 0) {
        pXStack_10b8 = (X509 *)0x10dc81;
        write_local_cert_cold_1();
      }
      if (iVar2 == 0) {
LAB_0010dc26:
        if (v_flag != 0) {
          pXStack_10b8 = (X509 *)0x10dc39;
          puts("CN\'s of request and certificate matched!");
        }
      }
      else {
        pXStack_10b8 = (X509 *)0x10dbc0;
        pXVar10 = X509_get_subject_name(unaff_R13);
        pXStack_10b8 = (X509 *)0x10dbd8;
        X509_NAME_oneline(pXVar10,acStack_8b0,0x400);
        pXStack_10b8 = (X509 *)0x10dbe4;
        pXVar10 = (X509_NAME *)X509_REQ_get_subject_name(request);
        pXVar12 = aXStack_cb0;
        pXStack_10b8 = (X509 *)0x10dbfc;
        X509_NAME_oneline(pXVar10,(char *)pXVar12,0x400);
        if (v_flag != 0) {
          pXStack_10b8 = (X509 *)0x10dc17;
          printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n",
                 pXVar12,acStack_8b0);
        }
        pXStack_10b8 = (X509 *)0x10dc22;
        iVar2 = strcmp(acStack_8b0,(char *)pXVar12);
        if (iVar2 == 0) goto LAB_0010dc26;
        pXStack_10b8 = (X509 *)0x10dc8b;
        write_local_cert_cold_2();
      }
      pXStack_10b8 = (X509 *)0x10dc41;
      unaff_R15 = (char **)X509_get_subject_name(unaff_R13);
      pXStack_10b8 = (X509 *)0x10dc4c;
      pXVar10 = X509_get_issuer_name(unaff_R13);
      pXStack_10b8 = (X509 *)0x10dc57;
      pFVar8 = (FILE *)unaff_R15;
      iVar2 = X509_NAME_cmp((X509_NAME *)unaff_R15,pXVar10);
      pXVar18 = unaff_R13;
      if (iVar2 != 0) break;
      uVar3 = (int)buf + 1;
      buf = (char **)(ulong)uVar3;
      pXStack_10b8 = (X509 *)0x10dc66;
      pFVar8 = pFVar6;
      iVar2 = OPENSSL_sk_num();
      pXVar18 = (X509 *)localcert;
    } while ((int)uVar3 < iVar2);
  }
  localcert = (X509 *)pXVar18;
  if (localcert == (X509 *)0x0) {
    pXStack_10b8 = (X509 *)0x10dd37;
    write_local_cert_cold_5();
LAB_0010dd37:
    pXStack_10b8 = (X509 *)0x10dd3c;
    write_local_cert_cold_4();
  }
  else {
    buf = &l_char;
    pXStack_10b8 = (X509 *)0x10dcb8;
    pFVar8 = (FILE *)l_char;
    pFVar9 = fopen(l_char,"w");
    if (pFVar9 == (FILE *)0x0) goto LAB_0010dd37;
    if (v_flag != 0) {
      pXStack_10b8 = (X509 *)0x10dce2;
      printf("%s: certificate written as %s\n",pname,l_char);
    }
    if (d_flag != 0) {
      pXStack_10b8 = (X509 *)0x10dd04;
      PEM_write_X509(_stdout,(X509 *)localcert);
    }
    pXStack_10b8 = (X509 *)0x10dd13;
    pFVar8 = pFVar9;
    iVar2 = PEM_write_X509(pFVar9,(X509 *)localcert);
    pFVar6 = pFVar9;
    if (iVar2 == 1) {
      pXStack_10b8 = (X509 *)0x10dd20;
      iVar2 = fclose(pFVar9);
      return iVar2;
    }
  }
  pXStack_10b8 = (X509 *)write_other_cert;
  write_local_cert_cold_3();
  piStack_10d8 = &v_flag;
  ppcVar22 = *(char ***)(*(long *)(pFVar8->__pad5 + 0x20) + 0x10);
  pXStack_1500 = (X509 *)0x10dd6e;
  pFVar9 = (FILE *)ppcVar22;
  pFStack_14f0 = pFVar8;
  pFStack_10e0 = pFVar6;
  pXStack_10d0 = unaff_R13;
  pFStack_10c8 = (FILE *)buf;
  pFStack_10c0 = (FILE *)unaff_R15;
  pXStack_10b8 = pXVar12;
  iVar2 = OPENSSL_sk_num();
  pXVar18 = (X509 *)0x0;
  if (0 < iVar2) {
    unaff_R13 = (X509 *)0x0;
    do {
      pXStack_1500 = (X509 *)0x10dd86;
      pXVar12 = (X509 *)OPENSSL_sk_value(ppcVar22,unaff_R13);
      pcVar11 = pname;
      if (v_flag != 0) {
        pXStack_1500 = (X509 *)0x10dda7;
        pXVar10 = X509_get_subject_name(pXVar12);
        buf = (char **)aFStack_14e8;
        pXStack_1500 = (X509 *)0x10ddbc;
        pcVar4 = X509_NAME_oneline(pXVar10,(char *)buf,0x400);
        pXStack_1500 = (X509 *)0x10ddd0;
        printf("%s: found certificate with\n  subject: %s\n",pcVar11,pcVar4);
        pXStack_1500 = (X509 *)0x10ddd8;
        pXVar10 = X509_get_issuer_name(pXVar12);
        pXStack_1500 = (X509 *)0x10dde8;
        pcVar4 = X509_NAME_oneline(pXVar10,(char *)buf,0x400);
        pXStack_1500 = (X509 *)0x10ddf9;
        printf("  issuer: %s\n",pcVar4);
        piVar20 = (int *)pcVar11;
      }
      pXStack_1500 = (X509 *)0x10de01;
      pFVar9 = (FILE *)X509_get_serialNumber(pXVar12);
      pXStack_1500 = (X509 *)0x10de19;
      iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar9,
                               *(ASN1_INTEGER **)((long)pFStack_14f0->__pad3 + 8));
      pXVar18 = pXVar12;
      if (iVar2 == 0) break;
      uVar3 = (int)unaff_R13 + 1;
      unaff_R13 = (X509 *)(ulong)uVar3;
      pXStack_1500 = (X509 *)0x10de2c;
      pFVar9 = (FILE *)ppcVar22;
      iVar2 = OPENSSL_sk_num();
      pXVar18 = (X509 *)0x0;
    } while ((int)uVar3 < iVar2);
  }
  if (pXVar18 == (X509 *)0x0) {
    pXStack_1500 = (X509 *)0x10ded0;
    write_other_cert_cold_3();
  }
  else {
    ppcVar22 = &w_char;
    pXStack_1500 = (X509 *)0x10de54;
    pFVar9 = (FILE *)w_char;
    pFVar6 = fopen(w_char,"w");
    if (pFVar6 != (FILE *)0x0) {
      if (v_flag != 0) {
        pXStack_1500 = (X509 *)0x10de83;
        printf("%s: certificate written as %s\n",pname,w_char);
      }
      if (d_flag != 0) {
        pXStack_1500 = (X509 *)0x10dea1;
        PEM_write_X509(_stdout,pXVar18);
      }
      pXStack_1500 = (X509 *)0x10deac;
      pFVar9 = pFVar6;
      iVar2 = PEM_write_X509(pFVar6,pXVar18);
      buf = (char **)pFVar6;
      if (iVar2 == 1) {
        pXStack_1500 = (X509 *)0x10deb9;
        iVar2 = fclose(pFVar6);
        return iVar2;
      }
      goto LAB_0010ded5;
    }
  }
  pXStack_1500 = (X509 *)0x10ded5;
  write_other_cert_cold_2();
LAB_0010ded5:
  pXStack_1500 = (X509 *)write_ca_ra;
  write_other_cert_cold_1();
  pXStack_1528 = pXVar18;
  piStack_1520 = piVar20;
  pXStack_1518 = unaff_R13;
  pFStack_1510 = (FILE *)buf;
  pFStack_1508 = (FILE *)ppcVar22;
  pXStack_1500 = pXVar12;
  bp = BIO_new_mem_buf(pFVar9->_IO_read_end,*(int *)&pFVar9->_IO_read_base);
  pPVar13 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar13 == (PKCS7 *)0x0) {
    pcVar11 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
    fprintf(_stderr,pcVar11,pname);
LAB_0010df31:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar2 = OBJ_obj2nid(pPVar13->type);
    if (iVar2 == 0x16) {
      lVar19 = ((pPVar13->d).data)->flags;
      if (lVar19 != 0) {
        pPStack_1d88 = pPVar13;
        pBStack_1d80 = bp;
        iVar2 = OPENSSL_sk_num(lVar19);
        if (0 < iVar2) {
          uVar21 = 0;
          lStack_1d78 = lVar19;
          do {
            memset(acStack_1d30,0,0x400);
            memset(acStack_1930,0,0x400);
            pXVar12 = (X509 *)OPENSSL_sk_value(lVar19,uVar21);
            snprintf(acStack_1930,0x400,"%s-%d",c_char,uVar21);
            pcVar11 = pname;
            if (v_flag != 0) {
              pXVar10 = X509_get_subject_name(pXVar12);
              pcVar4 = X509_NAME_oneline(pXVar10,acStack_1d30,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar11,pcVar4);
            }
            if (v_flag != 0) {
              pXVar10 = X509_get_issuer_name(pXVar12);
              pcVar11 = X509_NAME_oneline(pXVar10,acStack_1d30,0x400);
              printf("  issuer: %s\n",pcVar11);
            }
            iVar2 = X509_digest(pXVar12,(EVP_MD *)fp_alg,abStack_1d70,&uStack_1d8c);
            if (iVar2 == 0) goto LAB_0010df31;
            iVar2 = X509_get_ext_by_NID(pXVar12,0x57,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar14 = X509_get_ext(pXVar12,iVar2);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar14,0,0);
                putchar(10);
              }
            }
            iVar2 = X509_get_ext_by_NID(pXVar12,0x53,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
              }
            }
            else {
              pXVar14 = X509_get_ext(pXVar12,iVar2);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar14,0,0);
                putchar(10);
              }
            }
            if (v_flag != 0) {
              iVar2 = EVP_MD_get_type(fp_alg);
              pcVar11 = OBJ_nid2sn(iVar2);
              printf("  %s fingerprint: ",pcVar11);
              uVar16 = (ulong)uStack_1d8c;
              if (0 < (int)uStack_1d8c) {
                uVar15 = 0;
                do {
                  uVar1 = uVar15 + 1;
                  uVar17 = 10;
                  if (uVar1 != (uVar16 & 0xffffffff)) {
                    uVar17 = 0x3a;
                  }
                  printf("%02X%c",(ulong)abStack_1d70[uVar15],uVar17);
                  uVar16 = (ulong)(int)uStack_1d8c;
                  uVar15 = uVar1;
                } while ((long)uVar1 < (long)uVar16);
              }
            }
            pFVar6 = fopen(acStack_1930,"w");
            if (pFVar6 == (FILE *)0x0) {
              pcVar11 = "%s: cannot open cert file for writing\n";
              goto LAB_0010df71;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_1930);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,pXVar12);
            }
            iVar2 = PEM_write_X509(pFVar6,pXVar12);
            if (iVar2 != 1) {
              pcVar11 = "%s: error while writing certificate file\n";
              goto LAB_0010df27;
            }
            fclose(pFVar6);
            lVar19 = lStack_1d78;
            uVar3 = (int)uVar21 + 1;
            uVar21 = (ulong)uVar3;
            iVar2 = OPENSSL_sk_num(lStack_1d78);
          } while ((int)uVar3 < iVar2);
        }
        PKCS7_free(pPStack_1d88);
        BIO_free(pBStack_1d80);
        exit(0);
      }
      pcVar11 = "%s: cannot find certificates\n";
LAB_0010df71:
      fprintf(_stderr,pcVar11,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

int get_signed_attribute(STACK_OF(X509_ATTRIBUTE) *attribs, int nid,int type, char **buffer){
	int		rc;
	ASN1_TYPE	*asn1_type;
	int		len;

	/* Find attribute */
	rc = get_attribute(attribs, nid, &asn1_type);
	if (rc == 1) {
		if (v_flag)
			fprintf(stderr, "%s: error finding attribute\n",pname);
		return (1);
	}
	if (ASN1_TYPE_get(asn1_type) != type) {
		fprintf(stderr, "%s: wrong ASN.1 type\n",pname);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Copy data */
	len = ASN1_STRING_length(asn1_type->value.asn1_string);
	if (len <= 0) {
		return (1);
	} else if (d_flag)
		printf("%s: allocating %d bytes for attribute\n", pname, len);
	if (type == V_ASN1_PRINTABLESTRING) {
		*buffer = (char *)malloc(len + 1);
	} else {
		*buffer = (char *)malloc(len);
	}
	if (*buffer == NULL) {
		fprintf(stderr, "%s: cannot malloc space for attribute\n",
			pname);
		exit (SCEP_PKISTATUS_P7);
	}
/* for compatibility with older openssl versions
   from: https://wiki.openssl.org/index.php/OpenSSL_1.1.0_Changes

*/
#if OPENSSL_VERSION_NUMBER < 0x10100000L
	memcpy(*buffer, ASN1_STRING_data(asn1_type->value.asn1_string), len);
#else
	memcpy(*buffer, ASN1_STRING_get0_data(asn1_type->value.asn1_string), len);
#endif

	/* Add null terminator if it's a PrintableString */
	if (type == V_ASN1_PRINTABLESTRING) {
		(*buffer)[len] = 0;
		len++;
	}

	return (0);
}